

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::Mat(Mat *this,int m,int n,double *a)

{
  double dVar1;
  double *pdVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->n_rows_ = m;
  this->n_cols_ = n;
  uVar3 = n * m;
  uVar5 = 0;
  if ((int)uVar3 < 1) {
    pdVar2 = (double *)0x0;
  }
  else {
    pdVar2 = (double *)operator_new__((ulong)uVar3 << 3);
  }
  this->v_ = pdVar2;
  dVar1 = *a;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2[uVar5] = dVar1;
  }
  return;
}

Assistant:

Mat::Mat(int m, int n, const double& a) : n_rows_(m), n_cols_(n),v_(m*n>0 ? new double[m*n] : NULL)
{
	for(int i=0; i<m*n; i++) v_[i] = a;
}